

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O2

int CfdAddTapBranchByScriptTreeString(void *handle,void *tree_handle,char *tree_string)

{
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *this;
  bool bVar1;
  reference this_00;
  reference this_01;
  CfdException *this_02;
  allocator local_119;
  TapBranch add_branch;
  TapBranch local_a0;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&add_branch,"TapscriptTree",(allocator *)&local_a0);
  cfd::capi::CheckBuffer(tree_handle,(string *)&add_branch);
  std::__cxx11::string::~string((string *)&add_branch);
  bVar1 = cfd::capi::IsEmptyString(tree_string);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_a0,tree_string,&local_119);
    cfd::core::TapBranch::FromString(&add_branch,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    this = *(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
            ((long)tree_handle + 0x18);
    if ((this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
        _M_impl.super__Vector_impl_data._M_start ==
        (this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      this_01 = std::
                vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                ::at(*(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                       **)((long)tree_handle + 0x10),0);
      cfd::core::TaprootScriptTree::AddBranch(this_01,&add_branch);
    }
    else {
      this_00 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at(this,0)
      ;
      cfd::core::TapBranch::ToString_abi_cxx11_((string *)&local_a0,this_00);
      std::__cxx11::string::~string((string *)&local_a0);
      if (local_a0._8_8_ == 0) {
        cfd::core::TapBranch::TapBranch(&local_a0,&add_branch);
        cfd::core::TapBranch::operator=(this_00,&local_a0);
        cfd::core::TapBranch::~TapBranch(&local_a0);
      }
      else {
        cfd::core::TapBranch::AddBranch(this_00,&add_branch);
      }
    }
    cfd::core::TapBranch::~TapBranch(&add_branch);
    return 0;
  }
  add_branch._vptr_TapBranch = (_func_int **)0x4fb1b0;
  add_branch.has_leaf_ = true;
  add_branch.leaf_version_ = '\x02';
  add_branch._10_2_ = 0;
  add_branch.script_._vptr_Script = (_func_int **)anon_var_dwarf_74a919;
  cfd::core::logger::warn<>((CfdSourceLocation *)&add_branch,"tree_string is null or empty.");
  this_02 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&add_branch,"Failed to parameter. tree_string is null or empty.",
             (allocator *)&local_a0);
  cfd::core::CfdException::CfdException(this_02,kCfdIllegalArgumentError,(string *)&add_branch);
  __cxa_throw(this_02,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTapBranchByScriptTreeString(
    void* handle, void* tree_handle, const char* tree_string) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    if (IsEmptyString(tree_string)) {
      warn(CFD_LOG_SOURCE, "tree_string is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tree_string is null or empty.");
    }
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);

    TapBranch add_branch = TapBranch::FromString(tree_string);
    if (!buffer->branch_buffer->empty()) {
      auto& branch = buffer->branch_buffer->at(0);
      if (branch.ToString().empty()) {
        branch = TapBranch(add_branch);  // override
      } else {
        branch.AddBranch(add_branch);
      }
    } else {
      auto& dest_tree = buffer->tree_buffer->at(0);
      dest_tree.AddBranch(add_branch);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}